

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O3

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::SplitMesh
          (SplitLargeMeshesProcess_Vertex *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  pointer *ppaVar1;
  aiColor4D *paVar2;
  undefined8 *puVar3;
  pointer *pppVar4;
  uint uVar5;
  aiVector3D *paVar6;
  iterator __position;
  long *plVar7;
  aiBone *paVar8;
  long lVar9;
  iterator iVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  pointer paVar27;
  pointer paVar28;
  uint c_2;
  int iVar29;
  uint uVar30;
  uint uVar31;
  VertexWeightTable *pVVar32;
  aiVertexWeight aVar33;
  void *pvVar34;
  uint *puVar35;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_00;
  ulong uVar36;
  ulong *puVar37;
  uint uVar38;
  ulong *puVar39;
  uint c;
  uint *puVar40;
  long lVar41;
  ulong uVar42;
  const_iterator iter;
  pointer ppVar43;
  ulong uVar44;
  ulong uVar45;
  pointer *pppVar46;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avWasCopied;
  undefined8 *local_4d8;
  int local_4d0;
  vector<aiFace,_std::allocator<aiFace>_> local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  char *local_458;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_450
  ;
  ulong local_448;
  SplitLargeMeshesProcess_Vertex *local_440;
  undefined1 local_438 [8];
  uint *puStack_430;
  
  if (pMesh->mNumVertices <= this->LIMIT) {
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar10._M_current =
         (avList->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current !=
        (avList->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar10._M_current)->first = pMesh;
      *(uint **)&(iVar10._M_current)->second = puStack_430;
      pppVar4 = &(avList->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar4 = *pppVar4 + 1;
      return;
    }
    local_438 = (undefined1  [8])pMesh;
    std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
    _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
              ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                *)avList,iVar10,(pair<aiMesh_*,_unsigned_int> *)local_438);
    return;
  }
  pVVar32 = ComputeVertexBoneWeightTable(pMesh);
  uVar31 = pMesh->mNumVertices;
  uVar5 = this->LIMIT;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._0_4_ = 0xffffffff;
  local_440 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_478,(ulong)uVar31,(value_type_conflict1 *)local_438);
  uVar45 = (ulong)pMesh->mNumFaces / (ulong)(uVar31 / uVar5 + 1);
  local_448 = (ulong)(uint)((int)(uVar45 >> 3) + (int)uVar45);
  local_458 = (pMesh->mName).data;
  uVar45 = 0;
  local_450 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
               *)avList;
  do {
    uVar31 = local_440->LIMIT;
    aVar33 = (aiVertexWeight)operator_new(0x520);
    *(uint *)aVar33 = 0;
    *(uint *)((long)aVar33 + 8) = 0;
    memset((uint *)((long)aVar33 + 0x10),0,0xcc);
    ((uint *)((long)aVar33 + 0xe0))[0] = 0;
    ((uint *)((long)aVar33 + 0xe0))[1] = 0;
    ((uint *)((long)aVar33 + 0xe8))[0] = 0;
    ((uint *)((long)aVar33 + 0xe8))[1] = 0;
    *(undefined1 *)((long)aVar33 + 0xf0) = 0;
    memset((void *)((long)aVar33 + 0xf1),0x1b,0x3ff);
    *(uint *)((long)aVar33 + 0x4f0) = 0;
    ((uint *)((long)aVar33 + 0x4f8))[0] = 0;
    ((uint *)((long)aVar33 + 0x4f8))[1] = 0;
    ((uint *)((long)aVar33 + 0x500))[0] = 0;
    ((uint *)((long)aVar33 + 0x500))[1] = 0;
    ((uint *)((long)aVar33 + 0x508))[0] = 0;
    ((uint *)((long)aVar33 + 0x508))[1] = 0;
    ((uint *)((long)aVar33 + 0x510))[0] = 0;
    ((uint *)((long)aVar33 + 0x510))[1] = 0;
    *(uint *)((long)aVar33 + 0x518) = 0;
    *(uint *)((long)aVar33 + 4) = 0;
    memset((uint *)((long)aVar33 + 0x30),0,0xa0);
    *(uint *)((long)aVar33 + 0xe8) = pMesh->mMaterialIndex;
    if (aVar33 != (aiVertexWeight)pMesh) {
      uVar5 = (pMesh->mName).length;
      *(uint *)((long)aVar33 + 0xec) = uVar5;
      memcpy((uint *)((long)aVar33 + 0xf0),local_458,(ulong)uVar5);
      *(undefined1 *)((long)((long)aVar33 + 0xf0) + (ulong)uVar5) = 0;
    }
    puVar40 = (uint *)((long)aVar33 + 0xe0);
    uVar42 = (ulong)uVar31;
    if (pMesh->mNumBones != 0 && pMesh->mBones != (aiBone **)0x0) {
      uVar44 = (ulong)pMesh->mNumBones << 3;
      pvVar34 = operator_new__(uVar44);
      *(void **)puVar40 = pvVar34;
      memset(pvVar34,0,uVar44);
    }
    local_4d0 = (int)uVar45;
    if ((local_4d0 != 0) &&
       (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      memset(local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,
             ((long)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
              (-4 - (long)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar5 = pMesh->mNumVertices;
    if (uVar5 != 0 && pMesh->mVertices != (aiVector3D *)0x0) {
      pvVar34 = operator_new__(uVar42 * 0xc);
      if (uVar31 != 0) {
        memset(pvVar34,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)aVar33 + 0x10) = pvVar34;
    }
    if (pMesh->mNormals != (aiVector3D *)0x0 && uVar5 != 0) {
      pvVar34 = operator_new__(uVar42 * 0xc);
      if (uVar31 != 0) {
        memset(pvVar34,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)aVar33 + 0x18) = pvVar34;
    }
    if ((pMesh->mBitangents == (aiVector3D *)0x0 || pMesh->mTangents == (aiVector3D *)0x0) ||
        uVar5 == 0) {
      if (uVar5 != 0) goto LAB_0015d1ce;
    }
    else {
      uVar44 = uVar42 * 0xc;
      pvVar34 = operator_new__(uVar44);
      if (uVar31 != 0) {
        memset(pvVar34,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)aVar33 + 0x20) = pvVar34;
      pvVar34 = operator_new__(uVar44);
      if (uVar31 != 0) {
        memset(pvVar34,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)aVar33 + 0x28) = pvVar34;
LAB_0015d1ce:
      lVar41 = 0;
      do {
        if (pMesh->mColors[lVar41] == (aiColor4D *)0x0) break;
        pvVar34 = operator_new__(uVar42 << 4);
        if (uVar31 != 0) {
          memset(pvVar34,0,uVar42 << 4);
        }
        *(void **)((uint *)((long)aVar33 + 0x30) + lVar41 * 2) = pvVar34;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 8);
      if (uVar5 != 0) {
        lVar41 = 0;
        do {
          if (*(long *)((long)pMesh->mTextureCoords + lVar41 * 2) == 0) break;
          *(undefined4 *)((long)((long)aVar33 + 0xb0) + lVar41) =
               *(undefined4 *)((long)pMesh->mNumUVComponents + lVar41);
          pvVar34 = operator_new__(uVar42 * 0xc);
          if (uVar31 != 0) {
            memset(pvVar34,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)((long)((long)aVar33 + 0x70) + lVar41 * 2) = pvVar34;
          lVar41 = lVar41 + 4;
        } while (lVar41 != 0x20);
      }
    }
    std::vector<aiFace,_std::allocator<aiFace>_>::reserve(&local_498,local_448);
    uVar45 = uVar45 & 0xffffffff;
    do {
      if (pMesh->mNumFaces <= uVar45) break;
      uVar5 = pMesh->mFaces[uVar45].mNumIndices;
      uVar42 = (ulong)uVar5;
      if (uVar42 == 0) {
        iVar29 = 0;
      }
      else {
        uVar44 = 0;
        iVar29 = 0;
        do {
          iVar29 = iVar29 + (uint)(local_478.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [pMesh->mFaces[uVar45].mIndices[uVar44]] == 0xffffffff);
          uVar44 = uVar44 + 1;
        } while (uVar42 != uVar44);
      }
      if (uVar31 < iVar29 + *(uint *)((long)aVar33 + 4)) break;
      local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
      puStack_430 = (uint *)0x0;
      std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                (&local_498,(aiFace *)local_438);
      if (puStack_430 != (uint *)0x0) {
        operator_delete__(puStack_430);
      }
      paVar27 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].mNumIndices = uVar5;
      puVar35 = (uint *)operator_new__(uVar42 * 4);
      paVar27[-1].mIndices = puVar35;
      uVar38 = paVar27[-1].mNumIndices - 1;
      uVar30 = 8;
      if (uVar38 < 3) {
        uVar30 = *(uint *)(&DAT_001f3e2c + (ulong)uVar38 * 4);
      }
      *(uint *)aVar33 = uVar30 | *(uint *)aVar33;
      if (uVar5 != 0) {
        uVar44 = 0;
        do {
          uVar5 = pMesh->mFaces[uVar45].mIndices[uVar44];
          if (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5] == 0xffffffff) {
            paVar6 = pMesh->mVertices;
            lVar41 = *(long *)((long)aVar33 + 0x10);
            uVar30 = *(uint *)((long)aVar33 + 4);
            *(float *)(lVar41 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar5].z;
            *(undefined8 *)(lVar41 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar5);
            paVar6 = pMesh->mNormals;
            if ((paVar6 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
              lVar41 = *(long *)((long)aVar33 + 0x18);
              uVar30 = *(uint *)((long)aVar33 + 4);
              *(float *)(lVar41 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar5].z;
              *(undefined8 *)(lVar41 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar5);
            }
            paVar6 = pMesh->mTangents;
            if (((paVar6 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
               (pMesh->mNumVertices != 0)) {
              lVar41 = *(long *)((long)aVar33 + 0x20);
              uVar30 = *(uint *)((long)aVar33 + 4);
              *(float *)(lVar41 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar5].z;
              *(undefined8 *)(lVar41 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar5);
              paVar6 = pMesh->mBitangents;
              lVar41 = *(long *)((long)aVar33 + 0x28);
              uVar30 = *(uint *)((long)aVar33 + 4);
              *(float *)(lVar41 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar5].z;
              *(undefined8 *)(lVar41 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar5);
            }
            lVar41 = 0;
            do {
              paVar6 = pMesh->mTextureCoords[lVar41];
              if ((paVar6 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                lVar9 = *(long *)((uint *)((long)aVar33 + 0x70) + lVar41 * 2);
                uVar30 = *(uint *)((long)aVar33 + 4);
                *(float *)(lVar9 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar5].z;
                *(undefined8 *)(lVar9 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar5);
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 8);
            lVar41 = 0;
            do {
              if ((pMesh->mColors[lVar41] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                paVar2 = pMesh->mColors[lVar41] + uVar5;
                uVar11 = *(undefined8 *)&paVar2->b;
                puVar3 = (undefined8 *)
                         (*(long *)((uint *)((long)aVar33 + 0x30) + lVar41 * 2) +
                         (ulong)*(uint *)((long)aVar33 + 4) * 0x10);
                *puVar3 = *(undefined8 *)paVar2;
                puVar3[1] = uVar11;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 8);
            uVar30 = *(uint *)((long)aVar33 + 4);
            paVar27[-1].mIndices[uVar44] = uVar30;
            if ((pVVar32 != (VertexWeightTable *)0x0) &&
               (ppVar43 = pVVar32[uVar30].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               ppVar43 !=
               pVVar32[uVar30].
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              do {
                lVar41 = *(long *)puVar40;
                this_00 = *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                           (lVar41 + (ulong)ppVar43->first * 8);
                if (this_00 == (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0) {
                  this_00 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                            operator_new(0x18);
                  (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                   (lVar41 + (ulong)ppVar43->first * 8) = this_00;
                }
                local_438._4_4_ = ppVar43->second;
                local_438._0_4_ = *(uint *)((long)aVar33 + 4);
                __position._M_current =
                     (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                  _M_realloc_insert<aiVertexWeight>(this_00,__position,(aiVertexWeight *)local_438);
                }
                else {
                  (__position._M_current)->mVertexId = *(uint *)((long)aVar33 + 4);
                  (__position._M_current)->mWeight = (float)local_438._4_4_;
                  ppaVar1 = &(this_00->
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                ppVar43 = ppVar43 + 1;
              } while (ppVar43 !=
                       pVVar32[uVar30].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
              uVar30 = *(uint *)((long)aVar33 + 4);
            }
            local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = uVar30;
            *(uint *)((long)aVar33 + 4) = *(uint *)((long)aVar33 + 4) + 1;
          }
          else {
            paVar27[-1].mIndices[uVar44] =
                 local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
          }
          uVar44 = uVar44 + 1;
        } while (uVar44 != uVar42);
      }
      uVar45 = uVar45 + 1;
    } while (*(uint *)((long)aVar33 + 4) != uVar31);
    uVar31 = pMesh->mNumBones;
    if (uVar31 != 0 && pMesh->mBones != (aiBone **)0x0) {
      local_4d8 = *(undefined8 **)((long)aVar33 + 0xe0);
      uVar42 = 0;
      do {
        plVar7 = *(long **)(*(long *)puVar40 + uVar42 * 8);
        if (plVar7 != (long *)0x0) {
          paVar8 = pMesh->mBones[uVar42];
          puVar35 = (uint *)operator_new(0x450);
          *puVar35 = 0;
          *(undefined1 *)(puVar35 + 1) = 0;
          memset((void *)((long)puVar35 + 5),0x1b,0x3ff);
          puVar35[0x101] = 0;
          puVar35[0x102] = 0;
          puVar35[0x103] = 0;
          puVar35[0x104] = 0x3f800000;
          puVar35[0x105] = 0;
          puVar35[0x106] = 0;
          puVar35[0x107] = 0;
          puVar35[0x108] = 0;
          puVar35[0x109] = 0x3f800000;
          puVar35[0x10a] = 0;
          puVar35[0x10b] = 0;
          puVar35[0x10c] = 0;
          puVar35[0x10d] = 0;
          puVar35[0x10e] = 0x3f800000;
          puVar35[0x10f] = 0;
          puVar35[0x110] = 0;
          puVar35[0x111] = 0;
          puVar35[0x112] = 0;
          puVar35[0x113] = 0x3f800000;
          *local_4d8 = puVar35;
          uVar31 = (paVar8->mName).length;
          if (0x3fe < uVar31) {
            uVar31 = 0x3ff;
          }
          uVar44 = (ulong)uVar31;
          local_438._0_4_ = uVar31;
          memcpy(local_438 + 4,(paVar8->mName).data,uVar44);
          local_438[uVar44 + 4] = 0;
          *puVar35 = uVar31;
          memcpy(puVar35 + 1,local_438 + 4,uVar44);
          *(undefined1 *)((long)puVar35 + uVar44 + 4) = 0;
          fVar23 = (paVar8->mOffsetMatrix).a1;
          fVar24 = (paVar8->mOffsetMatrix).a2;
          fVar25 = (paVar8->mOffsetMatrix).a3;
          fVar26 = (paVar8->mOffsetMatrix).a4;
          fVar19 = (paVar8->mOffsetMatrix).b1;
          fVar20 = (paVar8->mOffsetMatrix).b2;
          fVar21 = (paVar8->mOffsetMatrix).b3;
          fVar22 = (paVar8->mOffsetMatrix).b4;
          fVar15 = (paVar8->mOffsetMatrix).c1;
          fVar16 = (paVar8->mOffsetMatrix).c2;
          fVar17 = (paVar8->mOffsetMatrix).c3;
          fVar18 = (paVar8->mOffsetMatrix).c4;
          fVar12 = (paVar8->mOffsetMatrix).d2;
          fVar13 = (paVar8->mOffsetMatrix).d3;
          fVar14 = (paVar8->mOffsetMatrix).d4;
          puVar35[0x110] = (uint)(paVar8->mOffsetMatrix).d1;
          puVar35[0x111] = (uint)fVar12;
          puVar35[0x112] = (uint)fVar13;
          puVar35[0x113] = (uint)fVar14;
          puVar35[0x10c] = (uint)fVar15;
          puVar35[0x10d] = (uint)fVar16;
          puVar35[0x10e] = (uint)fVar17;
          puVar35[0x10f] = (uint)fVar18;
          puVar35[0x108] = (uint)fVar19;
          puVar35[0x109] = (uint)fVar20;
          puVar35[0x10a] = (uint)fVar21;
          puVar35[0x10b] = (uint)fVar22;
          puVar35[0x104] = (uint)fVar23;
          puVar35[0x105] = (uint)fVar24;
          puVar35[0x106] = (uint)fVar25;
          puVar35[0x107] = (uint)fVar26;
          lVar41 = plVar7[1];
          lVar9 = *plVar7;
          uVar36 = lVar41 - lVar9 >> 3;
          puVar35[0x101] = (uint)uVar36;
          uVar36 = uVar36 & 0xffffffff;
          uVar44 = uVar36 * 8;
          pvVar34 = operator_new__(uVar44);
          if (uVar36 != 0) {
            memset(pvVar34,0,uVar44);
          }
          *(void **)(puVar35 + 0x102) = pvVar34;
          memcpy(pvVar34,(void *)*plVar7,lVar41 - lVar9 & 0x7fffffff8);
          if ((void *)*plVar7 != (void *)0x0) {
            operator_delete((void *)*plVar7);
          }
          local_4d8 = local_4d8 + 1;
          operator_delete(plVar7);
          *(uint *)((long)aVar33 + 0xd8) = *(uint *)((long)aVar33 + 0xd8) + 1;
          uVar31 = pMesh->mNumBones;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < uVar31);
    }
    paVar28 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_finish;
    paVar27 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar42 = (long)local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar44 = (long)uVar42 >> 4;
    puVar37 = (ulong *)operator_new__(-(ulong)(uVar44 >> 0x3c != 0) | uVar42 | 8);
    *puVar37 = uVar44;
    puVar37 = puVar37 + 1;
    if (paVar28 != paVar27) {
      puVar39 = puVar37;
      do {
        *(undefined4 *)puVar39 = 0;
        puVar39[1] = 0;
        puVar39 = puVar39 + 2;
      } while (puVar39 != (ulong *)(uVar42 + (long)puVar37));
    }
    *(ulong **)((long)aVar33 + 0xd0) = puVar37;
    *(uint *)((long)aVar33 + 8) = (uint)uVar44;
    if ((uint)uVar44 != 0) {
      lVar41 = 0;
      uVar42 = 0;
      do {
        aiFace::operator=((aiFace *)(*(long *)((long)aVar33 + 0xd0) + lVar41),
                          (aiFace *)
                          ((long)&(local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar41))
        ;
        uVar42 = uVar42 + 1;
        lVar41 = lVar41 + 0x10;
      } while (uVar42 < *(uint *)((long)aVar33 + 8));
    }
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar10._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 8);
    local_438 = (undefined1  [8])aVar33;
    if (iVar10._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 0x10)) {
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                (local_450,iVar10,(pair<aiMesh_*,_unsigned_int> *)local_438);
    }
    else {
      (iVar10._M_current)->first = (aiMesh *)aVar33;
      *(uint **)&(iVar10._M_current)->second = puStack_430;
      *(long *)(local_450 + 8) = *(long *)(local_450 + 8) + 0x10;
    }
    uVar31 = pMesh->mNumFaces;
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_498);
  } while (uVar31 != (uint)uVar45);
  if (pVVar32 != (VertexWeightTable *)0x0) {
    pppVar46 = &pVVar32[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar43 = pVVar32[-1].
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppVar43 == (pointer)0x0) {
      operator_delete__(pppVar46);
    }
    else {
      lVar41 = (long)ppVar43 * 0x18;
      do {
        pvVar34 = *(void **)((long)&pVVar32[-1].
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar41);
        if (pvVar34 != (void *)0x0) {
          operator_delete(pvVar34);
        }
        lVar41 = lVar41 + -0x18;
      } while (lVar41 != 0);
      operator_delete__(pppVar46);
      if (pMesh == (aiMesh *)0x0) goto LAB_0015d9d2;
    }
  }
  aiMesh::~aiMesh(pMesh);
LAB_0015d9d2:
  operator_delete(pMesh);
  if (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumVertices > SplitLargeMeshesProcess_Vertex::LIMIT) {
        typedef std::vector< std::pair<unsigned int,float> > VertexWeightTable;

        // build a per-vertex weight list if necessary
        VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(pMesh);

        // we need to split this mesh into sub meshes
        // determine the estimated size of a submesh
        // (this could be too large. Max waste is a single digit percentage)
        const unsigned int iSubMeshes = (pMesh->mNumVertices / SplitLargeMeshesProcess_Vertex::LIMIT) + 1;

        // create a std::vector<unsigned int> to indicate which vertices
        // have already been copied
        std::vector<unsigned int> avWasCopied;
        avWasCopied.resize(pMesh->mNumVertices,0xFFFFFFFF);

        // try to find a good estimate for the number of output faces
        // per mesh. Add 12.5% as buffer
        unsigned int iEstimatedSize = pMesh->mNumFaces / iSubMeshes;
        iEstimatedSize += iEstimatedSize >> 3;

        // now generate all submeshes
        unsigned int iBase( 0 );
        while (true) {
            const unsigned int iOutVertexNum = SplitLargeMeshesProcess_Vertex::LIMIT;
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumVertices    = 0;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            typedef std::vector<aiVertexWeight> BoneWeightList;
            if (pMesh->HasBones()) {
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];
                ::memset(pcMesh->mBones,0,sizeof(void*)*pMesh->mNumBones);
            }

            // clear the temporary helper array
            if (iBase) {
                // we can't use memset here we unsigned int needn' be 32 bits
                for (auto &elem : avWasCopied) {
                    elem = 0xffffffff;
                }
            }

            // output vectors
            std::vector<aiFace> vFaces;

            // reserve enough storage for most cases
            if (pMesh->HasPositions()) {
                pcMesh->mVertices = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iOutVertexNum];
                pcMesh->mBitangents = new aiVector3D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasVertexColors(c);++c) {
                pcMesh->mColors[c] = new aiColor4D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasTextureCoords(c);++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                pcMesh->mTextureCoords[c] = new aiVector3D[iOutVertexNum];
            }
            vFaces.reserve(iEstimatedSize);

            // (we will also need to copy the array of indices)
            while (iBase < pMesh->mNumFaces) {
                // allocate a new array
                const unsigned int iNumIndices = pMesh->mFaces[iBase].mNumIndices;

                // doesn't catch degenerates but is quite fast
                unsigned int iNeed = 0;
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF == avWasCopied[iIndex]) {
                        iNeed++;
                    }
                }
                if (pcMesh->mNumVertices + iNeed > iOutVertexNum) {
                    // don't use this face
                    break;
                }

                vFaces.push_back(aiFace());
                aiFace& rFace = vFaces.back();

                // setup face type and number of indices
                rFace.mNumIndices = iNumIndices;
                rFace.mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (rFace.mNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF != avWasCopied[iIndex]) {
                        rFace.mIndices[v] = avWasCopied[iIndex];
                        continue;
                    }

                    // copy positions
                    pcMesh->mVertices[pcMesh->mNumVertices] = (pMesh->mVertices[iIndex]);

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[pcMesh->mNumVertices] = (pMesh->mNormals[iIndex]);
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[pcMesh->mNumVertices] = (pMesh->mTangents[iIndex]);
                        pcMesh->mBitangents[pcMesh->mNumVertices] = (pMesh->mBitangents[iIndex]);
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c)) {
                            pcMesh->mTextureCoords[c][pcMesh->mNumVertices] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][pcMesh->mNumVertices] = pMesh->mColors[c][iIndex];
                        }
                    }
                    // check whether we have bone weights assigned to this vertex
                    rFace.mIndices[v] = pcMesh->mNumVertices;
                    if (avPerVertexWeights) {
                        VertexWeightTable& table = avPerVertexWeights[ pcMesh->mNumVertices ];
                        if( !table.empty() ) {
                            for (VertexWeightTable::const_iterator iter =  table.begin();
                                    iter != table.end();++iter) {
                                // allocate the bone weight array if necessary
                                BoneWeightList* pcWeightList = (BoneWeightList*)pcMesh->mBones[(*iter).first];
                                if (nullptr == pcWeightList) {
                                    pcMesh->mBones[(*iter).first] = (aiBone*)(pcWeightList = new BoneWeightList());
                                }
                                pcWeightList->push_back(aiVertexWeight(pcMesh->mNumVertices,(*iter).second));
                            }
                        }
                    }

                    avWasCopied[iIndex] = pcMesh->mNumVertices;
                    pcMesh->mNumVertices++;
                }
                ++iBase;
                if(pcMesh->mNumVertices == iOutVertexNum) {
                    // break here. The face is only added if it was complete
                    break;
                }
            }

            // check which bones we'll need to create for this submesh
            if (pMesh->HasBones()) {
                aiBone** ppCurrent = pcMesh->mBones;
                for (unsigned int k = 0; k < pMesh->mNumBones;++k) {
                    // check whether the bone is existing
                    BoneWeightList* pcWeightList;
                    if ((pcWeightList = (BoneWeightList*)pcMesh->mBones[k])) {
                        aiBone* pcOldBone = pMesh->mBones[k];
                        aiBone* pcOut( nullptr );
                        *ppCurrent++ = pcOut = new aiBone();
                        pcOut->mName = aiString(pcOldBone->mName);
                        pcOut->mOffsetMatrix = pcOldBone->mOffsetMatrix;
                        pcOut->mNumWeights = (unsigned int)pcWeightList->size();
                        pcOut->mWeights = new aiVertexWeight[pcOut->mNumWeights];

                        // copy the vertex weights
                        ::memcpy(pcOut->mWeights,&pcWeightList->operator[](0),
                            pcOut->mNumWeights * sizeof(aiVertexWeight));

                        // delete the temporary bone weight list
                        delete pcWeightList;
                        pcMesh->mNumBones++;
                    }
                }
            }

            // copy the face list to the mesh
            pcMesh->mFaces = new aiFace[vFaces.size()];
            pcMesh->mNumFaces = (unsigned int)vFaces.size();

            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p] = vFaces[p];
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));

            if (iBase == pMesh->mNumFaces) {
                // have all faces ... finish the outer loop, too
                break;
            }
        }

        // delete the per-vertex weight list again
        delete[] avPerVertexWeights;

        // now delete the old mesh data
        delete pMesh;
        return;
    }
    avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
}